

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

curl_socket_t Curl_getconnectinfo(Curl_easy *data,connectdata **connp)

{
  curl_socket_t cVar1;
  Curl_multi *pCVar2;
  long local_28;
  connectdata *local_20;
  
  local_28 = (data->state).lastconnect_id;
  cVar1 = -1;
  if (local_28 != -1) {
    pCVar2 = data->multi_easy;
    if ((pCVar2 != (Curl_multi *)0x0) || (pCVar2 = data->multi, pCVar2 != (Curl_multi *)0x0)) {
      local_20 = (connectdata *)0x0;
      Curl_conncache_foreach(data,&pCVar2->conn_cache,&local_28,conn_is_conn);
      if (local_20 == (connectdata *)0x0) {
        (data->state).lastconnect_id = -1;
        cVar1 = -1;
      }
      else {
        if (connp != (connectdata **)0x0) {
          *connp = local_20;
          local_20->data = data;
        }
        cVar1 = local_20->sock[0];
      }
    }
  }
  return cVar1;
}

Assistant:

curl_socket_t Curl_getconnectinfo(struct Curl_easy *data,
                                  struct connectdata **connp)
{
  DEBUGASSERT(data);

  /* this works for an easy handle:
   * - that has been used for curl_easy_perform()
   * - that is associated with a multi handle, and whose connection
   *   was detached with CURLOPT_CONNECT_ONLY
   */
  if((data->state.lastconnect_id != -1) && (data->multi_easy || data->multi)) {
    struct connectdata *c;
    struct connfind find;
    find.id_tofind = data->state.lastconnect_id;
    find.found = NULL;

    Curl_conncache_foreach(data, data->multi_easy?
                           &data->multi_easy->conn_cache:
                           &data->multi->conn_cache, &find, conn_is_conn);

    if(!find.found) {
      data->state.lastconnect_id = -1;
      return CURL_SOCKET_BAD;
    }

    c = find.found;
    if(connp) {
      /* only store this if the caller cares for it */
      *connp = c;
      c->data = data;
    }
    return c->sock[FIRSTSOCKET];
  }
  return CURL_SOCKET_BAD;
}